

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O1

void __thiscall LTWeather::Set(LTWeather *this)

{
  XDR_float *pXVar1;
  char *pcVar2;
  char *pcVar3;
  string local_38;
  
  XPLMSetDatai(wdr_update_immediately.super_XDR.dr,this->update_immediately);
  XPLMSetDatai(wdr_change_mode.super_XDR.dr,3);
  if ((uint)ABS(this->visibility_reported_sm) < 0x7f800000) {
    XPLMSetDataf(wdr_visibility_reported_sm.super_XDR.dr);
  }
  if ((uint)ABS(this->sealevel_temperature_c) < 0x7f800000) {
    XPLMSetDataf(wdr_sealevel_temperature_c.super_XDR.dr);
  }
  if ((uint)ABS(this->qnh_base_elevation) < 0x7f800000) {
    XPLMSetDataf(wdr_qnh_base_elevation.super_XDR.dr);
  }
  if (NAN(this->qnh_pas)) {
    if (0x7f7fffff < (uint)ABS(this->sealevel_pressure_pas)) goto LAB_0019ff96;
    pXVar1 = &wdr_sealevel_pressure_pas;
  }
  else {
    if (0x7f7fffff < (uint)ABS(this->qnh_pas)) goto LAB_0019ff96;
    pXVar1 = &wdr_qnh_pas;
  }
  XPLMSetDataf((pXVar1->super_XDR).dr);
LAB_0019ff96:
  if ((uint)ABS(this->rain_percent) < 0x7f800000) {
    XPLMSetDataf(wdr_rain_percent.super_XDR.dr);
  }
  XDR_farr<13UL>::set(&wdr_wind_altitude_msl_m,&this->wind_altitude_msl_m);
  XDR_farr<13UL>::set(&wdr_wind_speed_msc,&this->wind_speed_msc);
  XDR_farr<13UL>::set(&wdr_wind_direction_degt,&this->wind_direction_degt);
  XDR_farr<13UL>::set(&wdr_shear_speed_msc,&this->shear_speed_msc);
  XDR_farr<13UL>::set(&wdr_shear_direction_degt,&this->shear_direction_degt);
  XDR_farr<13UL>::set(&wdr_turbulence,&this->turbulence);
  XDR_farr<13UL>::set(&wdr_dewpoint_deg_c,&this->dewpoint_deg_c);
  XDR_farr<13UL>::set(&wdr_temperature_altitude_msl_m,&this->temperature_altitude_msl_m);
  XDR_farr<13UL>::set(&wdr_temperatures_aloft_deg_c,&this->temperatures_aloft_deg_c);
  XDR_farr<3UL>::set(&wdr_cloud_type,&this->cloud_type);
  XDR_farr<3UL>::set(&wdr_cloud_coverage_percent,&this->cloud_coverage_percent);
  XDR_farr<3UL>::set(&wdr_cloud_base_msl_m,&this->cloud_base_msl_m);
  XDR_farr<3UL>::set(&wdr_cloud_tops_msl_m,&this->cloud_tops_msl_m);
  if ((uint)ABS(this->tropo_temp_c) < 0x7f800000) {
    XPLMSetDataf(wdr_tropo_temp_c.super_XDR.dr);
  }
  if ((uint)ABS(this->tropo_alt_m) < 0x7f800000) {
    XPLMSetDataf(wdr_tropo_alt_m.super_XDR.dr);
  }
  if ((uint)ABS(this->thermal_rate_ms) < 0x7f800000) {
    XPLMSetDataf(wdr_thermal_rate_ms.super_XDR.dr);
  }
  if ((uint)ABS(this->wave_amplitude) < 0x7f800000) {
    XPLMSetDataf(wdr_wave_amplitude.super_XDR.dr);
  }
  if ((uint)ABS(this->wave_dir) < 0x7f800000) {
    XPLMSetDataf(wdr_wave_dir.super_XDR.dr);
  }
  XPLMSetDataf((float)this->runway_friction,wdr_runway_friction.super_XDR.dr);
  if ((uint)ABS(this->variability_pct) < 0x7f800000) {
    XPLMSetDataf(wdr_variability_pct.super_XDR.dr);
  }
  if ((dataRefs.bDebugWeather != 0) && (dataRefs.iLogLevel == logDEBUG)) {
    pcVar3 = "Set Weather";
    if (this->update_immediately != false) {
      pcVar3 = "Set Weather immediately";
    }
    pcVar2 = pcVar3 + 0xb;
    if (this->update_immediately != false) {
      pcVar2 = pcVar3 + 0x17;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar3,pcVar2);
    Log(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void LTWeather::Set () const
{
    wdr_update_immediately.set(update_immediately);

    wdr_change_mode.set(WDR_CM_STATIC);             // 3 - Static (this also switches off XP's real weather)

    wdr_visibility_reported_sm.set(visibility_reported_sm);
    wdr_sealevel_temperature_c.set(sealevel_temperature_c);
    wdr_qnh_base_elevation.set(qnh_base_elevation);
    if (!std::isnan(qnh_pas))                       // prefer QNH as it is typically as reported by METAR
        wdr_qnh_pas.set(qnh_pas);
    else
        wdr_sealevel_pressure_pas.set(sealevel_pressure_pas);
    wdr_rain_percent.set(rain_percent);
    wdr_wind_altitude_msl_m.set(wind_altitude_msl_m);
    wdr_wind_speed_msc.set(wind_speed_msc);
    wdr_wind_direction_degt.set(wind_direction_degt);
    wdr_shear_speed_msc.set(shear_speed_msc);
    wdr_shear_direction_degt.set(shear_direction_degt);
    wdr_turbulence.set(turbulence);
    wdr_dewpoint_deg_c.set(dewpoint_deg_c);
    wdr_temperature_altitude_msl_m.set(temperature_altitude_msl_m);
    wdr_temperatures_aloft_deg_c.set(temperatures_aloft_deg_c);
    wdr_cloud_type.set(cloud_type);
    wdr_cloud_coverage_percent.set(cloud_coverage_percent);
    wdr_cloud_base_msl_m.set(cloud_base_msl_m);
    wdr_cloud_tops_msl_m.set(cloud_tops_msl_m);
    wdr_tropo_temp_c.set(tropo_temp_c);
    wdr_tropo_alt_m.set(tropo_alt_m);
    wdr_thermal_rate_ms.set(thermal_rate_ms);
    wdr_wave_amplitude.set(wave_amplitude);
    wdr_wave_dir.set(wave_dir);
    wdr_runway_friction.set(float(runway_friction));
    wdr_variability_pct.set(variability_pct);

    if (dataRefs.ShallLogWeather())
        Log(update_immediately ? "Set Weather immediately" : "Set Weather");
}